

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningAgent.cpp
# Opt level: O1

Plan * __thiscall
multi_agent_planning::PlanningAgent::computeSingleAgentPlan
          (Plan *__return_storage_ptr__,PlanningAgent *this,Instance instance)

{
  vector<float,_std::allocator<float>_> d;
  vector<unsigned_long,_std::allocator<unsigned_long>_> p;
  vector<float,_std::allocator<float>_> local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  allocator_type local_60 [8];
  Vertex local_58;
  pointer local_50;
  pointer local_40;
  undefined8 local_30;
  
  (__return_storage_ptr__->actions).
  super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->actions).
  super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->actions).
  super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_78,
             (long)(this->graph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->graph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,local_60);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_90,
             (long)(this->graph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->graph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_60);
  local_50 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_30 = 0;
  local_58 = instance.goal;
  boost::
  astar_search<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::astar_heuristic<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,float>,multi_agent_planning::astar_goal_visitor<unsigned_long>,boost::graph_visitor_t,boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,float,float&>,boost::vertex_distance_t,boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,unsigned_long,unsigned_long&>,boost::vertex_predecessor_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::directed_tag,int,int&,unsigned_long,multi_agent_planning::Action,int_multi_agent_planning::Action::*>,boost::edge_weight_t,boost::no_property>>>>
            (&this->graph,instance.start);
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Plan PlanningAgent::computeSingleAgentPlan(const Instance instance) {

	Plan plan;

	vector<Vertex> p(num_vertices(graph));
	vector<float> d(num_vertices(graph));

	try {
		astar_search(
			graph, instance.start, 
			astar_heuristic<Graph, float>(), 
			weight_map(get(&Action::cost, graph)).
			predecessor_map(make_iterator_property_map(p.begin(), get(vertex_index, graph))).
  	  distance_map(make_iterator_property_map(d.begin(), get(vertex_index, graph))).
  	  visitor(astar_goal_visitor<Vertex>(instance.goal))
  	);
  }
  catch(found_goal fg) {

  	planHelper(instance.goal, p, d, plan);

  }

	return plan;
}